

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O1

vector<char,_std::allocator<char>_> *
cnpy::operator+=(vector<char,_std::allocator<char>_> *lhs,char rhs)

{
  pointer *ppcVar1;
  iterator __position;
  char val;
  char local_9;
  
  __position._M_current =
       (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_9 = rhs;
    std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
              ((vector<char,std::allocator<char>> *)lhs,__position,&local_9);
  }
  else {
    *__position._M_current = rhs;
    ppcVar1 = &(lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return lhs;
}

Assistant:

std::vector<char>& operator+=(std::vector<char>& lhs, const T rhs) {
        //write in little endian
        for(size_t byte = 0; byte < sizeof(T); byte++) {
            char val = *((char*)&rhs+byte); 
            lhs.push_back(val);
        }
        return lhs;
    }